

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::GetFieldName_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FieldDescriptor *descriptor)

{
  Type TVar1;
  
  TVar1 = FieldDescriptor::type((FieldDescriptor *)this);
  if (TVar1 == TYPE_GROUP) {
    this = (csharp *)FieldDescriptor::message_type((FieldDescriptor *)this);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,*(string **)this);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFieldName(const FieldDescriptor* descriptor) {
  if (descriptor->type() == FieldDescriptor::TYPE_GROUP) {
    return descriptor->message_type()->name();
  } else {
    return descriptor->name();
  }
}